

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  
  if (this->unknown_ != (string *)0x0) {
    uVar3 = (ulong)(num * 8 + 3);
    cVar4 = (char)this->unknown_;
    if (0x7f < num * 8) {
      do {
        std::__cxx11::string::push_back(cVar4);
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar4);
  }
  pcVar2 = ParseContext::ParseGroup<google::protobuf::internal::UnknownFieldLiteParserHelper>
                     (ctx,this,ptr,num * 8 + 3);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else if (this->unknown_ != (string *)0x0) {
    uVar3 = (ulong)(num << 3 | 4);
    cVar4 = (char)this->unknown_;
    if (0x7f < num << 3) {
      do {
        std::__cxx11::string::push_back(cVar4);
        bVar1 = 0x3fff < uVar3;
        uVar3 = uVar3 >> 7;
      } while (bVar1);
    }
    std::__cxx11::string::push_back(cVar4);
  }
  return pcVar2;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroup(this, ptr, num * 8 + 3);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }